

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
AddOne<ot::commissioner::persistent_storage::Network,ot::commissioner::persistent_storage::NetworkId>
          (PersistentStorageJson *this,Network *aValue,NetworkId *aRetId,string *aSeqName,
          string *aArrName)

{
  json *this_00;
  value_t vVar1;
  pointer pcVar2;
  json_value jVar3;
  Status SVar4;
  Status SVar5;
  reference pvVar6;
  Network insValue;
  undefined1 local_b0 [8];
  json_value local_a8;
  undefined1 local_a0 [8];
  json_value local_98;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  char local_78 [16];
  undefined6 uStack_68;
  undefined2 local_62;
  undefined6 uStack_60;
  _Alloc_hider local_58;
  char local_48 [16];
  int local_38;
  
  SVar4 = CacheFromFile(this);
  SVar5 = kError;
  if (SVar4 == kSuccess) {
    local_90._0_4_ = aValue->mId;
    local_90._4_4_ = aValue->mDomainId;
    local_88._M_p = local_78;
    pcVar2 = (aValue->mName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,pcVar2 + (aValue->mName)._M_string_length);
    uStack_60 = (undefined6)((ulong)*(undefined8 *)((long)&aValue->mXpan + 6) >> 0x10);
    uStack_68 = (undefined6)aValue->mXpan;
    local_62 = (undefined2)(aValue->mXpan >> 0x30);
    local_58._M_p = local_48;
    pcVar2 = (aValue->mMlp)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar2,pcVar2 + (aValue->mMlp)._M_string_length);
    local_38 = aValue->mCcm;
    this_00 = &this->mCache;
    pvVar6 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(this_00,aSeqName);
    from_json(pvVar6,aRetId);
    local_98._0_4_ = aRetId->mId + 1;
    local_98.number_integer._4_4_ = 0;
    local_a0[0] = number_unsigned;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_a0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_a0);
    pvVar6 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_00,aSeqName);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_a0);
    vVar1 = pvVar6->m_type;
    pvVar6->m_type = local_a0[0];
    jVar3 = pvVar6->m_value;
    pvVar6->m_value = local_98;
    local_a0[0] = vVar1;
    local_98 = jVar3;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant(pvVar6);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_a0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_a0 + 8),local_a0[0]);
    local_90._0_4_ = aRetId->mId;
    pvVar6 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_00,aArrName);
    local_b0[0] = null;
    local_a8.object = (object_t *)0x0;
    to_json((json *)local_b0,(Network *)local_90);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_b0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::push_back(pvVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_b0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_b0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_b0 + 8),local_b0[0]);
    SVar5 = CacheToFile(this);
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    if (local_88._M_p != local_78) {
      operator_delete(local_88._M_p);
    }
  }
  return SVar5;
}

Assistant:

Status AddOne(V const &aValue, I &aRetId, std::string aSeqName, std::string aArrName)
    {
        if (CacheFromFile() != Status::kSuccess)
        {
            return Status::kError;
        }

        V insValue = aValue;
        mCache.at(aSeqName).get_to(aRetId);
        mCache[aSeqName] = aRetId.mId + 1;

        insValue.mId = aRetId;

        mCache[aArrName].push_back(insValue);

        return CacheToFile();
    }